

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterNaive.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscWriterNaive::PutDeferred
          (SscWriterNaive *this,VariableBase *variable,void *data)

{
  bool bVar1;
  __type _Var2;
  reference this_00;
  size_t sVar3;
  uint8_t *puVar4;
  void *pvVar5;
  size_t sVar6;
  char *pcVar7;
  iterator this_01;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  value_type *b_2;
  BlockInfo *b_1;
  iterator __end3;
  iterator __begin3;
  BlockVec *__range3;
  bool found;
  Dims vShape;
  Dims vCount;
  Dims vStart;
  value_type *b;
  string *dataString;
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  *in_stack_fffffffffffffe88;
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  *in_stack_fffffffffffffe90;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe98;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  undefined5 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffee0;
  string local_100 [32];
  reference local_e0;
  reference in_stack_ffffffffffffff28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff30;
  __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
  local_c8;
  long local_c0;
  byte local_b1;
  unsigned_long *local_b0;
  iterator in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff68;
  iterator in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff78;
  
  if (*(int *)(in_RSI + 0x28) == 0xe) {
    std::
    vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
    ::emplace_back<>(in_stack_fffffffffffffe90);
    this_00 = std::
              vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
              ::back(in_stack_fffffffffffffe90);
    std::__cxx11::string::operator=((string *)this_00,(string *)(in_RSI + 8));
    this_00->type = String;
    this_00->shapeId = *(ShapeID *)(in_RSI + 0x40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (in_stack_ffffffffffffff30,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff28);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (in_stack_ffffffffffffff30,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff28);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (in_stack_ffffffffffffff30,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff28);
    sVar3 = Buffer::size((Buffer *)(in_RDI + 0x38));
    this_00->bufferStart = sVar3;
    sVar3 = std::__cxx11::string::size();
    this_00->bufferCount = sVar3;
    Buffer::resize((Buffer *)in_stack_ffffffffffffff60._M_current,
                   (size_t)in_stack_ffffffffffffff58._M_current);
    puVar4 = Buffer::data((Buffer *)(in_RDI + 0x38),0);
    sVar3 = this_00->bufferStart;
    pvVar5 = (void *)std::__cxx11::string::data();
    sVar6 = std::__cxx11::string::size();
    memcpy(puVar4 + sVar3,pvVar5,sVar6);
    std::__cxx11::string::size();
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffeb7,
                        CONCAT16(in_stack_fffffffffffffeb6,
                                 CONCAT15(in_stack_fffffffffffffeb5,in_stack_fffffffffffffeb0))),
               (size_type)in_stack_fffffffffffffea8);
    pcVar7 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1d6d66);
    pvVar5 = (void *)std::__cxx11::string::data();
    sVar6 = std::__cxx11::string::size();
    memcpy(pcVar7,pvVar5,sVar6);
  }
  else if ((((*(int *)(in_RSI + 0x40) != 1) && (*(int *)(in_RSI + 0x40) != 4)) &&
           (*(int *)(in_RSI + 0x28) != 0xe)) || (*(int *)(in_RDI + 0x28) == 0)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (*(int *)(*(long *)(in_RDI + 0x88) + 0x58) != 0) {
      in_stack_ffffffffffffff78 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffe88);
      in_stack_ffffffffffffff70 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffe88);
      std::
      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      in_stack_ffffffffffffff68 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffe88);
      in_stack_ffffffffffffff60 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffe88);
      std::
      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      in_stack_ffffffffffffff58 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffe88);
      local_b0 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffe88);
      std::
      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    local_b1 = 0;
    local_c0 = in_RDI + 0x90;
    local_c8._M_current =
         (BlockInfo *)
         std::
         vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
         ::begin(in_stack_fffffffffffffe88);
    this_01 = std::
              vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
              ::end(in_stack_fffffffffffffe88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)in_stack_fffffffffffffe90,
                              (__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)in_stack_fffffffffffffe88), bVar1) {
      in_stack_ffffffffffffff28 =
           __gnu_cxx::
           __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
           ::operator*(&local_c8);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffeb7,
                                       CONCAT16(in_stack_fffffffffffffeb6,
                                                CONCAT15(in_stack_fffffffffffffeb5,
                                                         in_stack_fffffffffffffeb0))),
                              in_stack_fffffffffffffea8);
      if (((_Var2) &&
          (in_stack_fffffffffffffeb7 =
                AreSameDims((Dims *)in_stack_fffffffffffffea8,
                            (Dims *)in_stack_fffffffffffffea0._M_current),
          (bool)in_stack_fffffffffffffeb7)) &&
         ((in_stack_fffffffffffffeb6 =
                AreSameDims((Dims *)in_stack_fffffffffffffea8,
                            (Dims *)in_stack_fffffffffffffea0._M_current),
          (bool)in_stack_fffffffffffffeb6 &&
          (in_stack_fffffffffffffeb5 =
                AreSameDims((Dims *)in_stack_fffffffffffffea8,
                            (Dims *)in_stack_fffffffffffffea0._M_current),
          (bool)in_stack_fffffffffffffeb5)))) {
        in_stack_fffffffffffffea8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Buffer::data((Buffer *)(in_RDI + 0x38),0);
        memcpy(&in_stack_fffffffffffffea8->_M_dataplus + in_stack_ffffffffffffff28->bufferStart,
               in_RDX,in_stack_ffffffffffffff28->bufferCount);
        local_b1 = 1;
      }
      __gnu_cxx::
      __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
      ::operator++(&local_c8);
    }
    if ((local_b1 & 1) == 0) {
      std::
      vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
      ::emplace_back<>(in_stack_fffffffffffffe90);
      local_e0 = std::
                 vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                 ::back(in_stack_fffffffffffffe90);
      std::__cxx11::string::operator=((string *)local_e0,(string *)(in_RSI + 8));
      local_e0->type = *(DataType *)(in_RSI + 0x28);
      local_e0->shapeId = *(ShapeID *)(in_RSI + 0x40);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01._M_current,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff28)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01._M_current,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff28)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01._M_current,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff28)
      ;
      local_e0->elementSize = *(size_t *)(in_RSI + 0x30);
      in_stack_fffffffffffffea0._M_current =
           (unsigned_long *)Buffer::size((Buffer *)(in_RDI + 0x38));
      local_e0->bufferStart = (size_t)in_stack_fffffffffffffea0._M_current;
      sVar3 = TotalDataSize((Dims *)in_stack_ffffffffffffff78._M_current,
                            (size_t)in_stack_ffffffffffffff70._M_current,
                            (ShapeID *)in_stack_ffffffffffffff68._M_current);
      local_e0->bufferCount = sVar3;
      Buffer::resize((Buffer *)in_stack_ffffffffffffff60._M_current,
                     (size_t)in_stack_ffffffffffffff58._M_current);
      puVar4 = Buffer::data((Buffer *)(in_RDI + 0x38),0);
      memcpy(puVar4 + local_e0->bufferStart,in_RDX,local_e0->bufferCount);
      if ((local_e0->shapeId == GlobalValue) || (local_e0->shapeId == LocalValue)) {
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffeb7,
                            CONCAT16(in_stack_fffffffffffffeb6,
                                     CONCAT15(in_stack_fffffffffffffeb5,in_stack_fffffffffffffeb0)))
                   ,(size_type)in_stack_fffffffffffffea8);
        pcVar7 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x1d72fa);
        memcpy(pcVar7,in_RDX,local_e0->bufferCount);
      }
      if (*(int *)(in_RSI + 0x28) == 0x10) {
        adios2::core::StructDefinition::StructName_abi_cxx11_();
        std::__cxx11::string::operator=((string *)&local_e0->structDef,local_100);
        std::__cxx11::string::~string(local_100);
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffea0._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffea0._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffea0._M_current);
  }
  return;
}

Assistant:

void SscWriterNaive::PutDeferred(VariableBase &variable, const void *data)
{

    if (variable.m_Type == DataType::String)
    {
        const auto dataString = reinterpret_cast<const std::string *>(data);
        m_Metadata.emplace_back();
        auto &b = m_Metadata.back();
        b.name = variable.m_Name;
        b.type = DataType::String;
        b.shapeId = variable.m_ShapeID;
        b.shape = variable.m_Shape;
        b.start = variable.m_Start;
        b.count = variable.m_Count;
        b.bufferStart = m_Buffer.size();
        b.bufferCount = dataString->size();
        m_Buffer.resize(b.bufferStart + b.bufferCount);
        std::memcpy(m_Buffer.data() + b.bufferStart, dataString->data(), dataString->size());
        b.value.resize(dataString->size());
        std::memcpy(b.value.data(), dataString->data(), dataString->size());
        return;
    }

    if ((variable.m_ShapeID == ShapeID::GlobalValue || variable.m_ShapeID == ShapeID::LocalValue ||
         variable.m_Type == DataType::String) &&
        m_WriterRank != 0)
    {
        return;
    }

    Dims vStart = variable.m_Start;
    Dims vCount = variable.m_Count;
    Dims vShape = variable.m_Shape;

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
    }

    bool found = false;
    for (const auto &b : m_Metadata)
    {
        if (b.name == variable.m_Name && ssc::AreSameDims(vStart, b.start) &&
            ssc::AreSameDims(vCount, b.count) && ssc::AreSameDims(vShape, b.shape))
        {
            std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
            found = true;
        }
    }

    if (!found)
    {
        m_Metadata.emplace_back();
        auto &b = m_Metadata.back();
        b.name = variable.m_Name;
        b.type = variable.m_Type;
        b.shapeId = variable.m_ShapeID;
        b.shape = vShape;
        b.start = vStart;
        b.count = vCount;
        b.elementSize = variable.m_ElementSize;
        b.bufferStart = m_Buffer.size();
        b.bufferCount = ssc::TotalDataSize(b.count, b.elementSize, b.shapeId);
        m_Buffer.resize(b.bufferStart + b.bufferCount);
        std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
        if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
        {
            b.value.resize(variable.m_ElementSize);
            std::memcpy(b.value.data(), data, b.bufferCount);
        }
        if (variable.m_Type == DataType::Struct)
        {
            b.structDef = reinterpret_cast<VariableStruct *>(&variable)
                              ->m_WriteStructDefinition->StructName();
        }
    }
}